

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintEnum
          (FieldValuePrinterWrapper *this,int32 val,string *name,BaseTextGenerator *generator)

{
  pointer pFVar1;
  undefined8 in_RDX;
  uint in_ESI;
  string *str;
  BaseTextGenerator *in_stack_ffffffffffffffb0;
  string local_40;
  undefined8 local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->((unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
                         *)0x70dcdf);
  str = &local_40;
  (*pFVar1->_vptr_FieldValuePrinter[0xb])(str,pFVar1,(ulong)local_c,local_18);
  TextFormat::BaseTextGenerator::PrintString(in_stack_ffffffffffffffb0,str);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void PrintEnum(int32 val, const std::string& name,
                 TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintEnum(val, name));
  }